

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

parser_error parse_prefs_expr(parser *p)

{
  undefined1 *puVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char f;
  char *expr;
  char local_19;
  char *local_18;
  
  puVar1 = (undefined1 *)parser_priv(p);
  if (puVar1 != (undefined1 *)0x0) {
    pcVar2 = parser_getstr(p,"expr");
    pcVar2 = string_make(pcVar2);
    local_18 = pcVar2;
    pcVar3 = process_pref_file_expr(&local_18,&local_19);
    if (*pcVar3 == '0') {
      bVar4 = pcVar3[1] == '\0';
    }
    else {
      bVar4 = false;
    }
    *puVar1 = bVar4;
    string_free(pcVar2);
    return PARSE_ERROR_NONE;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x249,"enum parser_error parse_prefs_expr(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_expr(struct parser *p)
{
	struct prefs_data *d = parser_priv(p);

	const char *v;
	char *str;
	char *expr;
	char f;

	assert(d != NULL);

	/* XXX this can be avoided with a rewrite of process_pref_file_expr */
	str = expr = string_make(parser_getstr(p, "expr"));

	/* Parse the expr */
	v = process_pref_file_expr(&expr, &f);

	/* Set flag */
	d->bypass = streq(v, "0");

	string_free(str);

	return PARSE_ERROR_NONE;
}